

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_group.hpp
# Opt level: O2

SerialProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>_>
* __thiscall
chains::
ModuleGroup<chains::SerialProcessor,_chains::ModuleHost<chains::delay::Module,_std::tuple<chains::Parameter<chains::delay::Length>_>,_chains::Expose<chains::delay::Length>_>_>
::makeProcessor<double>
          (SerialProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>_>
           *__return_storage_ptr__,
          ModuleGroup<chains::SerialProcessor,_chains::ModuleHost<chains::delay::Module,_std::tuple<chains::Parameter<chains::delay::Length>_>,_chains::Expose<chains::delay::Length>_>_>
          *this,double sampleRate)

{
  tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
  moduleProcessors;
  Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>
  local_70;
  Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>
  local_40;
  
  makeProcessors<double>
            ((tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
              *)&local_40,this,sampleRate);
  delay::Module::
  Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>
  ::Processor(&local_70,&local_40);
  delay::Module::
  Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>
  ::Processor((Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>
               *)__return_storage_ptr__,&local_70);
  boost::circular_buffer<double,_std::allocator<double>_>::destroy(&local_70.buffer_);
  boost::circular_buffer<double,_std::allocator<double>_>::destroy(&local_40.buffer_);
  return __return_storage_ptr__;
}

Assistant:

auto makeProcessor(const double sampleRate) const
  {
    auto moduleProcessors = makeProcessors<T>(sampleRate);
    return ProcessorGroup<T, decltype(moduleProcessors)>{moduleProcessors};
  }